

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O0

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<unsigned_int>::verifyValidity
          (StateQueryMemoryWriteGuard<unsigned_int> *this,ResultCollector *result)

{
  ResultCollector *pRVar1;
  bool bVar2;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ResultCollector *local_20;
  ResultCollector *result_local;
  StateQueryMemoryWriteGuard<unsigned_int> *this_local;
  
  local_20 = result;
  result_local = (ResultCollector *)this;
  bVar2 = isPreguardContaminated(this);
  pRVar1 = local_20;
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"pre-guard value was modified",&local_41);
    tcu::ResultCollector::fail(pRVar1,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    this_local._7_1_ = false;
  }
  else {
    bVar2 = isPostguardContaminated(this);
    pRVar1 = local_20;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"post-guard value was modified",&local_79);
      tcu::ResultCollector::fail(pRVar1,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::allocator<char>::~allocator(&local_79);
      this_local._7_1_ = false;
    }
    else {
      bVar2 = isUndefined(this);
      pRVar1 = local_20;
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"Get* did not return a value",&local_a1);
        tcu::ResultCollector::fail(pRVar1,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::allocator<char>::~allocator(&local_a1);
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::verifyValidity (tcu::ResultCollector& result) const
{
	using tcu::TestLog;

	if (isPreguardContaminated())
	{
		result.fail("pre-guard value was modified");
		return false;
	}
	else if (isPostguardContaminated())
	{
		result.fail("post-guard value was modified");
		return false;
	}
	else if (isUndefined())
	{
		result.fail("Get* did not return a value");
		return false;
	}

	return true;
}